

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
diligent_spirv_cross::Compiler::get_execution_mode_argument
          (Compiler *this,ExecutionMode mode,uint32_t index)

{
  bool bVar1;
  SPIREntryPoint *pSVar2;
  SPIRConstant *pSVar3;
  SPIREntryPoint *execution;
  uint32_t index_local;
  ExecutionMode mode_local;
  Compiler *this_local;
  
  pSVar2 = get_entry_point(this);
  if (mode == ExecutionModeInvocations) {
    this_local._4_4_ = pSVar2->invocations;
  }
  else if (mode == ExecutionModeLocalSize) {
    if (index == 0) {
      bVar1 = Bitset::get(&pSVar2->flags,0x26);
      if ((bVar1) && ((pSVar2->workgroup_size).id_x != 0)) {
        pSVar3 = get<diligent_spirv_cross::SPIRConstant>(this,(pSVar2->workgroup_size).id_x);
        this_local._4_4_ = SPIRConstant::scalar(pSVar3,0,0);
      }
      else {
        this_local._4_4_ = (pSVar2->workgroup_size).x;
      }
    }
    else if (index == 1) {
      bVar1 = Bitset::get(&pSVar2->flags,0x26);
      if ((bVar1) && ((pSVar2->workgroup_size).id_y != 0)) {
        pSVar3 = get<diligent_spirv_cross::SPIRConstant>(this,(pSVar2->workgroup_size).id_y);
        this_local._4_4_ = SPIRConstant::scalar(pSVar3,0,0);
      }
      else {
        this_local._4_4_ = (pSVar2->workgroup_size).y;
      }
    }
    else if (index == 2) {
      bVar1 = Bitset::get(&pSVar2->flags,0x26);
      if ((bVar1) && ((pSVar2->workgroup_size).id_z != 0)) {
        pSVar3 = get<diligent_spirv_cross::SPIRConstant>(this,(pSVar2->workgroup_size).id_z);
        this_local._4_4_ = SPIRConstant::scalar(pSVar3,0,0);
      }
      else {
        this_local._4_4_ = (pSVar2->workgroup_size).z;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else if (mode == ExecutionModeOutputVertices) {
    this_local._4_4_ = pSVar2->output_vertices;
  }
  else if (mode == ExecutionModeLocalSizeId) {
    bVar1 = Bitset::get(&pSVar2->flags,0x26);
    if (bVar1) {
      if (index == 0) {
        this_local._4_4_ = (pSVar2->workgroup_size).id_x;
      }
      else if (index == 1) {
        this_local._4_4_ = (pSVar2->workgroup_size).id_y;
      }
      else if (index == 2) {
        this_local._4_4_ = (pSVar2->workgroup_size).id_z;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else if (mode == ExecutionModeOutputPrimitivesEXT) {
    this_local._4_4_ = pSVar2->output_primitives;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Compiler::get_execution_mode_argument(spv::ExecutionMode mode, uint32_t index) const
{
	auto &execution = get_entry_point();
	switch (mode)
	{
	case ExecutionModeLocalSizeId:
		if (execution.flags.get(ExecutionModeLocalSizeId))
		{
			switch (index)
			{
			case 0:
				return execution.workgroup_size.id_x;
			case 1:
				return execution.workgroup_size.id_y;
			case 2:
				return execution.workgroup_size.id_z;
			default:
				return 0;
			}
		}
		else
			return 0;

	case ExecutionModeLocalSize:
		switch (index)
		{
		case 0:
			if (execution.flags.get(ExecutionModeLocalSizeId) && execution.workgroup_size.id_x != 0)
				return get<SPIRConstant>(execution.workgroup_size.id_x).scalar();
			else
				return execution.workgroup_size.x;
		case 1:
			if (execution.flags.get(ExecutionModeLocalSizeId) && execution.workgroup_size.id_y != 0)
				return get<SPIRConstant>(execution.workgroup_size.id_y).scalar();
			else
				return execution.workgroup_size.y;
		case 2:
			if (execution.flags.get(ExecutionModeLocalSizeId) && execution.workgroup_size.id_z != 0)
				return get<SPIRConstant>(execution.workgroup_size.id_z).scalar();
			else
				return execution.workgroup_size.z;
		default:
			return 0;
		}

	case ExecutionModeInvocations:
		return execution.invocations;

	case ExecutionModeOutputVertices:
		return execution.output_vertices;

	case ExecutionModeOutputPrimitivesEXT:
		return execution.output_primitives;

	default:
		return 0;
	}
}